

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

void __thiscall
boost::runtime::option::produce_argument
          (option *this,cstring *token,bool negative_form,arguments_store *store)

{
  bool bVar1;
  basic_cstring<const_char> *in_RCX;
  byte in_DL;
  basic_cstring<const_char> *in_RSI;
  std_string *in_stack_fffffffffffffef8;
  basic_cstring<const_char> *in_stack_ffffffffffffff00;
  bool *in_stack_ffffffffffffff20;
  cstring *in_stack_ffffffffffffff28;
  arguments_store *in_stack_ffffffffffffff30;
  arguments_store *in_stack_ffffffffffffff48;
  cstring *in_stack_ffffffffffffff50;
  cstring *in_stack_ffffffffffffff58;
  argument_factory<bool,_false,_false> *in_stack_ffffffffffffff60;
  
  bVar1 = unit_test::basic_cstring<const_char>::empty((basic_cstring<const_char> *)0x260959);
  if (bVar1) {
    unit_test::basic_cstring<const_char>::basic_cstring(in_RCX,in_stack_fffffffffffffef8);
    arguments_store::set<bool>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  }
  else {
    if ((in_DL & 1) != 0) {
      unit_test::basic_cstring<const_char>::basic_cstring
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      format_error::format_error
                ((format_error *)in_stack_ffffffffffffff00,(cstring *)&stack0xffffffffffffff58);
      specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::operator<<
                ((specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> *)
                 in_RSI,(char *)in_stack_ffffffffffffff00);
      unit_test::ut_detail::throw_exception<boost::runtime::format_error>
                ((format_error *)in_stack_ffffffffffffff00);
    }
    unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)&stack0xffffffffffffff28,in_RSI);
    unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    argument_factory<bool,_false,_false>::produce_argument
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48);
  }
  return;
}

Assistant:

virtual void    produce_argument( cstring token, bool negative_form, arguments_store& store ) const
    {
        if( token.empty() )
            store.set( p_name, !negative_form );
        else {
            BOOST_TEST_I_ASSRT( !negative_form,
                                format_error( p_name ) << "Can't set value to negative form of the argument." );

            m_arg_factory.produce_argument( token, p_name, store );
        }
    }